

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_recon.c
# Opt level: O2

void ihevc_recon_4x4_ttype1
               (WORD16 *pi2_src,UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 pred_strd,
               WORD32 dst_strd,WORD32 zero_cols)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  short *psVar4;
  long lVar5;
  byte *pbVar6;
  byte *pbVar7;
  bool bVar8;
  
  for (iVar3 = 0; iVar3 != 4; iVar3 = iVar3 + 1) {
    if ((zero_cols & 1U) == 0) {
      lVar5 = 4;
      psVar4 = pi2_src;
      pbVar6 = pu1_dst;
      pbVar7 = pu1_pred;
      while (bVar8 = lVar5 != 0, lVar5 = lVar5 + -1, bVar8) {
        iVar2 = (uint)*pbVar7 + (int)*psVar4;
        if (iVar2 < 1) {
          iVar2 = 0;
        }
        bVar1 = (byte)iVar2;
        if (0xfe < iVar2) {
          bVar1 = 0xff;
        }
        *pbVar6 = bVar1;
        psVar4 = psVar4 + src_strd;
        pbVar7 = pbVar7 + pred_strd;
        pbVar6 = pbVar6 + dst_strd;
      }
    }
    else {
      lVar5 = 4;
      pbVar6 = pu1_dst;
      pbVar7 = pu1_pred;
      while (bVar8 = lVar5 != 0, lVar5 = lVar5 + -1, bVar8) {
        *pbVar6 = *pbVar7;
        pbVar7 = pbVar7 + pred_strd;
        pbVar6 = pbVar6 + dst_strd;
      }
    }
    pi2_src = pi2_src + 1;
    pu1_dst = pu1_dst + 1;
    pu1_pred = pu1_pred + 1;
    zero_cols = zero_cols >> 1;
  }
  return;
}

Assistant:

void ihevc_recon_4x4_ttype1(WORD16 *pi2_src,
                            UWORD8 *pu1_pred,
                            UWORD8 *pu1_dst,
                            WORD32 src_strd,
                            WORD32 pred_strd,
                            WORD32 dst_strd,
                            WORD32 zero_cols)
{
    WORD32 i, j;
    WORD32 trans_size;

    trans_size = TRANS_SIZE_4;

    /* Reconstruction */

    for(i = 0; i < trans_size; i++)
    {
        /* Checking for Zero Cols */
        if((zero_cols & 1) == 1)
        {
            for(j = 0; j < trans_size; j++)
            {
                pu1_dst[j * dst_strd] = pu1_pred[j * pred_strd];
            }
        }
        else
        {
            for(j = 0; j < trans_size; j++)
            {
                pu1_dst[j * dst_strd] =
                                CLIP_U8(pi2_src[j * src_strd] + pu1_pred[j * pred_strd]);
            }
        }
        pi2_src++;
        pu1_dst++;
        pu1_pred++;
        zero_cols = zero_cols >> 1;
    }
}